

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ScaleProgram::setPos
          (ScaleProgram *this,GLuint buffer,GLuint vao)

{
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLuint vao_local;
  GLuint buffer_local;
  ScaleProgram *this_local;
  long lVar4;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x40))(0x8892,buffer);
  (**(code **)(lVar4 + 0xd8))(vao);
  do {
    (**(code **)(lVar4 + 0x19f0))(this->m_posLoc,4,0x1406,0,0,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,
                    "gl.vertexAttribPointer(m_posLoc, NUM_COMPONENTS, GL_FLOAT, false, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0xa3);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0xa6);
  return;
}

Assistant:

void ScaleProgram::setPos (GLuint buffer, GLuint vao)
{
	const Functions& gl = m_renderCtx.getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	gl.bindVertexArray(vao);
	GLU_CHECK_CALL_ERROR(
		gl.vertexAttribPointer(m_posLoc, NUM_COMPONENTS, GL_FLOAT, false, 0, DE_NULL),
		gl.getError());
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}